

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O1

ssize_t cf_h2_proxy_send(Curl_cfilter *cf,Curl_easy *data,void *buf,size_t len,CURLcode *err)

{
  bufq *q;
  uint uVar1;
  cf_h2_proxy_ctx *ctx;
  Curl_easy *pCVar2;
  _Bool _Var3;
  int iVar4;
  CURLcode CVar5;
  int32_t iVar6;
  int32_t iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  CURLcode CVar12;
  
  ctx = (cf_h2_proxy_ctx *)cf->ctx;
  if ((ctx->tunnel).state != H2_TUNNEL_ESTABLISHED) {
    *err = CURLE_SEND_ERROR;
    return -1;
  }
  pCVar2 = (ctx->call_data).data;
  (ctx->call_data).data = data;
  CVar12 = CURLE_SEND_ERROR;
  CVar5 = CVar12;
  if (((ctx->tunnel).field_0xa4 & 2) == 0) {
    uVar11 = (ctx->tunnel).upload_blocked_len;
    if (uVar11 == 0) {
      uVar11 = Curl_bufq_write(&(ctx->tunnel).sendbuf,(uchar *)buf,len,err);
      if ((long)uVar11 < 0) {
        if (*err != CURLE_AGAIN) goto LAB_006c1841;
        uVar11 = 0;
      }
    }
    else {
      if (len < uVar11) {
        Curl_failf(data,"HTTP/2 proxy, send again with decreased length");
        CVar5 = CURLE_HTTP2;
        goto LAB_006c1836;
      }
      (ctx->tunnel).upload_blocked_len = 0;
      *err = CURLE_OK;
    }
    q = &(ctx->tunnel).sendbuf;
    _Var3 = Curl_bufq_is_empty(q);
    if (!_Var3) {
      iVar4 = nghttp2_session_resume_data(ctx->h2,(ctx->tunnel).stream_id);
      iVar4 = nghttp2_is_fatal(iVar4);
      if (iVar4 != 0) goto LAB_006c1836;
    }
    CVar5 = proxy_h2_progress_ingress(cf,data);
    if (CVar5 == CURLE_OK) {
      CVar5 = proxy_h2_progress_egress(cf,data);
      if (CVar5 == CURLE_AGAIN) {
LAB_006c19db:
        iVar6 = nghttp2_session_get_stream_remote_window_size(ctx->h2,(ctx->tunnel).stream_id);
        if (((data != (Curl_easy *)0x0 && iVar6 == 0) && (cf != (Curl_cfilter *)0x0)) &&
           (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"[%d] remote flow window is exhausted",
                            (ulong)(uint)(ctx->tunnel).stream_id);
        }
        (ctx->tunnel).upload_blocked_len = uVar11;
        if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
            ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
          uVar1 = (ctx->tunnel).stream_id;
          uVar8 = nghttp2_session_get_remote_window_size(ctx->h2);
          Curl_trc_cf_infof(data,cf,"[%d] cf_send(len=%zu) BLOCK: win %u/%zu blocked_len=%zu",
                            (ulong)uVar1,len,(ulong)uVar8,(long)iVar6,uVar11);
        }
        drain_tunnel(cf,data,&ctx->tunnel);
        CVar5 = CURLE_AGAIN;
      }
      else if (CVar5 == CURLE_OK) {
        _Var3 = Curl_bufq_is_empty(q);
        if (!_Var3) goto LAB_006c19db;
        iVar4 = proxy_h2_should_close_session(ctx);
        if (iVar4 == 0) goto LAB_006c1841;
        CVar5 = CVar12;
        if ((((((ctx->tunnel).field_0xa4 & 2) == 0) &&
             (CVar5 = CURLE_HTTP2, data != (Curl_easy *)0x0)) && (cf != (Curl_cfilter *)0x0)) &&
           (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"[0] send: nothing to do in this session");
        }
      }
    }
  }
LAB_006c1836:
  *err = CVar5;
  uVar11 = 0xffffffffffffffff;
LAB_006c1841:
  _Var3 = Curl_bufq_is_empty(&(ctx->tunnel).recvbuf);
  if ((!_Var3) && ((-1 < (long)uVar11 || (*err == CURLE_AGAIN)))) {
    drain_tunnel(cf,data,&ctx->tunnel);
  }
  if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
     (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
    uVar1 = (ctx->tunnel).stream_id;
    CVar5 = *err;
    iVar6 = nghttp2_session_get_stream_remote_window_size(ctx->h2,uVar1);
    iVar7 = nghttp2_session_get_remote_window_size(ctx->h2);
    sVar9 = Curl_bufq_len(&(ctx->tunnel).sendbuf);
    sVar10 = Curl_bufq_len(&ctx->outbufq);
    Curl_trc_cf_infof(data,cf,
                      "[%d] cf_send(len=%zu) -> %zd, %d, h2 windows %d-%d (stream-conn), buffers %zu-%zu (stream-conn)"
                      ,(ulong)uVar1,len,uVar11,(ulong)CVar5,CONCAT44(extraout_var,iVar6),
                      CONCAT44(extraout_var_00,iVar7),sVar9,sVar10);
  }
  *(Curl_easy **)((long)cf->ctx + 8) = pCVar2;
  return uVar11;
}

Assistant:

static ssize_t cf_h2_proxy_send(struct Curl_cfilter *cf,
                                struct Curl_easy *data,
                                const void *buf, size_t len, CURLcode *err)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  struct cf_call_data save;
  int rv;
  ssize_t nwritten;
  CURLcode result;
  int blocked = 0;

  if(ctx->tunnel.state != H2_TUNNEL_ESTABLISHED) {
    *err = CURLE_SEND_ERROR;
    return -1;
  }
  CF_DATA_SAVE(save, cf, data);

  if(ctx->tunnel.closed) {
    nwritten = -1;
    *err = CURLE_SEND_ERROR;
    goto out;
  }
  else if(ctx->tunnel.upload_blocked_len) {
    /* the data in `buf` has already been submitted or added to the
     * buffers, but have been EAGAINed on the last invocation. */
    DEBUGASSERT(len >= ctx->tunnel.upload_blocked_len);
    if(len < ctx->tunnel.upload_blocked_len) {
      /* Did we get called again with a smaller `len`? This should not
       * happen. We are not prepared to handle that. */
      failf(data, "HTTP/2 proxy, send again with decreased length");
      *err = CURLE_HTTP2;
      nwritten = -1;
      goto out;
    }
    nwritten = (ssize_t)ctx->tunnel.upload_blocked_len;
    ctx->tunnel.upload_blocked_len = 0;
    *err = CURLE_OK;
  }
  else {
    nwritten = Curl_bufq_write(&ctx->tunnel.sendbuf, buf, len, err);
    if(nwritten < 0) {
      if(*err != CURLE_AGAIN)
        goto out;
      nwritten = 0;
    }
  }

  if(!Curl_bufq_is_empty(&ctx->tunnel.sendbuf)) {
    /* req body data is buffered, resume the potentially suspended stream */
    rv = nghttp2_session_resume_data(ctx->h2, ctx->tunnel.stream_id);
    if(nghttp2_is_fatal(rv)) {
      *err = CURLE_SEND_ERROR;
      nwritten = -1;
      goto out;
    }
  }

  result = proxy_h2_progress_ingress(cf, data);
  if(result) {
    *err = result;
    nwritten = -1;
    goto out;
  }

  /* Call the nghttp2 send loop and flush to write ALL buffered data,
   * headers and/or request body completely out to the network */
  result = proxy_h2_progress_egress(cf, data);
  if(result == CURLE_AGAIN) {
    blocked = 1;
  }
  else if(result) {
    *err = result;
    nwritten = -1;
    goto out;
  }
  else if(!Curl_bufq_is_empty(&ctx->tunnel.sendbuf)) {
    /* although we wrote everything that nghttp2 wants to send now,
     * there is data left in our stream send buffer unwritten. This may
     * be due to the stream's HTTP/2 flow window being exhausted. */
    blocked = 1;
  }

  if(blocked) {
    /* Unable to send all data, due to connection blocked or H2 window
     * exhaustion. Data is left in our stream buffer, or nghttp2's internal
     * frame buffer or our network out buffer. */
    size_t rwin = nghttp2_session_get_stream_remote_window_size(
                    ctx->h2, ctx->tunnel.stream_id);
    if(rwin == 0) {
      /* H2 flow window exhaustion.
       * FIXME: there is no way to HOLD all transfers that use this
       * proxy connection AND to UNHOLD all of them again when the
       * window increases.
       * We *could* iterate over all data on this conn maybe? */
      CURL_TRC_CF(data, cf, "[%d] remote flow "
                  "window is exhausted", ctx->tunnel.stream_id);
    }

    /* Whatever the cause, we need to return CURL_EAGAIN for this call.
     * We have unwritten state that needs us being invoked again and EAGAIN
     * is the only way to ensure that. */
    ctx->tunnel.upload_blocked_len = nwritten;
    CURL_TRC_CF(data, cf, "[%d] cf_send(len=%zu) BLOCK: win %u/%zu "
                "blocked_len=%zu",
                ctx->tunnel.stream_id, len,
                nghttp2_session_get_remote_window_size(ctx->h2), rwin,
                nwritten);
    drain_tunnel(cf, data, &ctx->tunnel);
    *err = CURLE_AGAIN;
    nwritten = -1;
    goto out;
  }
  else if(proxy_h2_should_close_session(ctx)) {
    /* nghttp2 thinks this session is done. If the stream has not been
     * closed, this is an error state for out transfer */
    if(ctx->tunnel.closed) {
      *err = CURLE_SEND_ERROR;
      nwritten = -1;
    }
    else {
      CURL_TRC_CF(data, cf, "[0] send: nothing to do in this session");
      *err = CURLE_HTTP2;
      nwritten = -1;
    }
  }

out:
  if(!Curl_bufq_is_empty(&ctx->tunnel.recvbuf) &&
     (nwritten >= 0 || *err == CURLE_AGAIN)) {
    /* data pending and no fatal error to report. Need to trigger
     * draining to avoid stalling when no socket events happen. */
    drain_tunnel(cf, data, &ctx->tunnel);
  }
  CURL_TRC_CF(data, cf, "[%d] cf_send(len=%zu) -> %zd, %d, "
              "h2 windows %d-%d (stream-conn), buffers %zu-%zu (stream-conn)",
              ctx->tunnel.stream_id, len, nwritten, *err,
              nghttp2_session_get_stream_remote_window_size(
                  ctx->h2, ctx->tunnel.stream_id),
              nghttp2_session_get_remote_window_size(ctx->h2),
              Curl_bufq_len(&ctx->tunnel.sendbuf),
              Curl_bufq_len(&ctx->outbufq));
  CF_DATA_RESTORE(cf, save);
  return nwritten;
}